

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cShaderBitfieldOperationTests.cpp
# Opt level: O1

bool __thiscall
glcts::ShaderBitfieldOperationCasePackSnorm::test
          (ShaderBitfieldOperationCasePackSnorm *this,Data *data)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  
  fVar1 = floorf(data->inVec4[0] * 127.0 + 0.5);
  fVar2 = floorf(data->inVec4[1] * 127.0 + 0.5);
  fVar3 = floorf(data->inVec4[2] * 127.0 + 0.5);
  fVar4 = floorf(data->inVec4[3] * 127.0 + 0.5);
  return ((int)fVar4 << 0x18 |
         ((int)fVar3 & 0xffU) << 0x10 | ((int)fVar2 & 0xffU) << 8 | (int)fVar1 & 0xffU) ==
         data->outUvec4[0];
}

Assistant:

virtual bool test(Data const* data)
	{
		GLuint expected = ((int(deFloatFloor(data->inVec4[0] * 127.0f + 0.5f)) & 0xFF) << 0) |
						  ((int(deFloatFloor(data->inVec4[1] * 127.0f + 0.5f)) & 0xFF) << 8) |
						  ((int(deFloatFloor(data->inVec4[2] * 127.0f + 0.5f)) & 0xFF) << 16) |
						  ((int(deFloatFloor(data->inVec4[3] * 127.0f + 0.5f)) & 0xFF) << 24);
		if (expected != data->outUvec4[0])
		{
			return false;
		}
		return true;
	}